

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Aig_Man_t *
generateWorkingAigWithDSC
          (Aig_Man_t *pAig,Abc_Ntk_t *pNtk,int *pIndex0Live,Vec_Ptr_t *vMasterBarriers)

{
  int windowBeginIndex;
  int withinWindowIndex;
  int pendingSignalIndex;
  Vec_Ptr_t *signalList;
  Aig_Man_t *pAVar1;
  
  signalList = collectCSSignalsWithDSC(pNtk,pAig);
  windowBeginIndex = collectWindowBeginSignalWithDSC(pNtk,pAig);
  withinWindowIndex = collectWithinWindowSignalWithDSC(pNtk,pAig);
  pendingSignalIndex = collectPendingSignalWithDSC(pNtk,pAig);
  pAVar1 = createNewAigWith0LivePoWithDSC
                     (pAig,signalList,pIndex0Live,windowBeginIndex,withinWindowIndex,
                      pendingSignalIndex,vMasterBarriers);
  if (signalList->pArray != (void **)0x0) {
    free(signalList->pArray);
  }
  free(signalList);
  return pAVar1;
}

Assistant:

Aig_Man_t *generateWorkingAigWithDSC( Aig_Man_t *pAig, Abc_Ntk_t *pNtk, int *pIndex0Live, Vec_Ptr_t *vMasterBarriers )
{
    Vec_Ptr_t *vSignalVector;
    Aig_Man_t *pAigNew;
    int pObjWithinWindow;
    int pObjWindowBegin;
    int pObjPendingSignal;

    vSignalVector = collectCSSignalsWithDSC( pNtk, pAig );    

    pObjWindowBegin = collectWindowBeginSignalWithDSC( pNtk, pAig );
    pObjWithinWindow = collectWithinWindowSignalWithDSC( pNtk, pAig );
    pObjPendingSignal = collectPendingSignalWithDSC( pNtk, pAig );

    pAigNew = createNewAigWith0LivePoWithDSC( pAig, vSignalVector, pIndex0Live, pObjWindowBegin, pObjWithinWindow, pObjPendingSignal, vMasterBarriers );
    Vec_PtrFree(vSignalVector);

    return pAigNew;
}